

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_example.cc
# Opt level: O3

void DumpTextureInfo(TextureInfo *texinfo,int indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  string local_68;
  string local_48;
  
  Indent_abi_cxx11_(&local_68,indent);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"index     : ",0xc);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,texinfo->index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  Indent_abi_cxx11_(&local_68,indent);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"texCoord  : TEXCOORD_",0x15);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,texinfo->texCoord);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  DumpExtensions(&texinfo->extensions,indent + 1);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"extras","");
  PrintValue(&local_68,&local_48,&texinfo->extras,indent + 1,true);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((texinfo->extensions_json_string)._M_string_length != 0) {
    Indent_abi_cxx11_(&local_68,indent);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"extensions(JSON string) = ",0x1a);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(texinfo->extensions_json_string)._M_dataplus._M_p,
                        (texinfo->extensions_json_string)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  if ((texinfo->extras_json_string)._M_string_length != 0) {
    Indent_abi_cxx11_(&local_68,indent);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"extras(JSON string) = ",0x16);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(texinfo->extras_json_string)._M_dataplus._M_p,
                        (texinfo->extras_json_string)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

static void DumpTextureInfo(const tinygltf::TextureInfo &texinfo,
                            const int indent) {
  std::cout << Indent(indent) << "index     : " << texinfo.index << "\n";
  std::cout << Indent(indent) << "texCoord  : TEXCOORD_" << texinfo.texCoord
            << "\n";
  DumpExtensions(texinfo.extensions, indent + 1);
  std::cout << PrintValue("extras", texinfo.extras, indent + 1) << "\n";

  if (!texinfo.extensions_json_string.empty()) {
    std::cout << Indent(indent)
              << "extensions(JSON string) = " << texinfo.extensions_json_string
              << "\n";
  }

  if (!texinfo.extras_json_string.empty()) {
    std::cout << Indent(indent)
              << "extras(JSON string) = " << texinfo.extras_json_string << "\n";
  }
}